

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLJointsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::JointsLoader::begin__joint(JointsLoader *this,joint__AttributeData *attributeData)

{
  _func_int **pp_Var1;
  long *in_RSI;
  HelperLoaderBase *in_RDI;
  ClassId in_stack_0000007c;
  ParserChar *in_stack_00000080;
  IFilePartLoader *in_stack_00000088;
  String *in_stack_fffffffffffffed8;
  Joint *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  IFilePartLoader *in_stack_fffffffffffffef0;
  UniqueId *in_stack_fffffffffffffef8;
  Joint *in_stack_ffffffffffffff00;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined1 local_a9 [40];
  allocator<char> local_81;
  string local_80 [39];
  undefined1 local_59 [36];
  undefined1 local_35;
  UniqueId local_28;
  long *local_10;
  
  local_10 = in_RSI;
  pp_Var1 = (_func_int **)operator_new(0x88);
  local_35 = 1;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1004>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
  COLLADAFW::Joint::Joint(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_35 = 0;
  in_RDI[1]._vptr_HelperLoaderBase = pp_Var1;
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  if (local_10[1] == 0) {
    if (*local_10 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      COLLADAFW::Joint::setName(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  else {
    in_stack_ffffffffffffff10 = (allocator<char> *)in_RDI[1]._vptr_HelperLoaderBase;
    in_stack_ffffffffffffff18 = (char *)local_10[1];
    in_stack_ffffffffffffff20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    COLLADAFW::Joint::setName(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
  }
  if (*local_10 != 0) {
    in_stack_fffffffffffffee0 = (Joint *)in_RDI[1]._vptr_HelperLoaderBase;
    in_stack_fffffffffffffee8 = (char *)*local_10;
    in_stack_fffffffffffffef0 = (IFilePartLoader *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    COLLADAFW::Joint::setOriginalId(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
  }
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  IFilePartLoader::addToSidTree
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
             (Object *)in_stack_fffffffffffffed8);
  return true;
}

Assistant:

bool JointsLoader::begin__joint( const joint__AttributeData& attributeData )
	{
		mCurrentJoint = FW_NEW COLLADAFW::Joint( getHandlingFilePartLoader()->createUniqueIdFromId( attributeData.id, COLLADAFW::Joint::ID()) );
		if ( attributeData.name )
		{
			mCurrentJoint->setName(attributeData.name);
		}
		else if ( attributeData.id )
		{
			mCurrentJoint->setName(attributeData.id);
		}

		if ( attributeData.id )
		{
			mCurrentJoint->setOriginalId(attributeData.id);
		}
		getHandlingFilePartLoader()->addToSidTree( attributeData.id, attributeData.sid, mCurrentJoint);
		return true;
	}